

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setInputs
          (UnidimLipmDcmEstimator *this,double dcm,double zmp)

{
  DstEvaluatorType dstEvaluator;
  double *pdVar1;
  undefined8 *puVar2;
  ActualDstType actualDst;
  MeasureVector local_28;
  double local_18;
  double local_10;
  
  local_18 = this->previousZmp_;
  this->previousZmp_ = zmp;
  local_10 = dcm;
  pdVar1 = (double *)malloc(8);
  if (pdVar1 != (double *)0x0) {
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
    *pdVar1 = local_10;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar1;
    ZeroDelayObserver::pushMeasurement((ZeroDelayObserver *)&this->filter_,&local_28);
    free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar1 = (double *)malloc(8);
    if (pdVar1 != (double *)0x0) {
      local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
      *pdVar1 = local_18;
      local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar1;
      ZeroDelayObserver::pushInput((ZeroDelayObserver *)&this->filter_,&local_28);
      free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void UnidimLipmDcmEstimator::setInputs(double dcm, double zmp)
{
  Vector1 u;
  Vector1 y;

  y(0) = dcm;

  /// The prediction of the state depends on the previous value of the ZMP
  u(0) = previousZmp_;
  previousZmp_ = zmp;

  filter_.pushMeasurement(y);
  filter_.pushInput(u);
}